

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ShaderAllocator::setSource
          (ShaderAllocator *this,ShaderType shaderType)

{
  mapped_type *ppSVar1;
  char *cSource;
  ShaderType shaderType_local;
  string source;
  
  shaderType_local = shaderType;
  (*this->m_srcGen->_vptr_SourceGenerator[2])(&source,this->m_srcGen,shaderType);
  cSource = source._M_dataplus._M_p;
  ppSVar1 = std::
            map<glu::ShaderType,_glu::Shader_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_glu::Shader_*>_>_>
            ::operator[](&this->m_shaders,&shaderType_local);
  glu::Shader::setSources(*ppSVar1,1,&cSource,(int *)0x0);
  std::__cxx11::string::~string((string *)&source);
  return;
}

Assistant:

void ShaderAllocator::setSource (const glu::ShaderType shaderType)
{
	DE_ASSERT(this->hasShader(shaderType));
	DE_ASSERT(!m_srcGen.finished(shaderType));

	const std::string	source	= m_srcGen.next(shaderType);
	const char* const	cSource	= source.c_str();

	m_shaders[shaderType]->setSources(1, &cSource, 0);
}